

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_10d873::CreateConstruct
                    (VmModule *module,SynBase *source,VmType type,VmValue *el0,VmValue *el1,
                    VmValue *el2,VmValue *el3)

{
  VmInstruction *pVVar1;
  uint uVar2;
  VmType type_00;
  VmValue *in_stack_fffffffffffffff8;
  
  type_00._0_8_ = type.structType;
  uVar2 = (el0->type).size;
  if (el1 != (VmValue *)0x0) {
    uVar2 = uVar2 + (el1->type).size;
  }
  if (el2 != (VmValue *)0x0) {
    uVar2 = uVar2 + (el2->type).size;
  }
  if (uVar2 == type.size) {
    type_00.structType = (TypeBase *)0x49;
    pVVar1 = CreateInstruction((anon_unknown_dwarf_10d873 *)module,(VmModule *)source,type._0_8_,
                               type_00,(VmInstructionType)el0,el1,el2,(VmValue *)0x0,(VmValue *)0x0,
                               in_stack_fffffffffffffff8);
    return &pVVar1->super_VmValue;
  }
  __assert_fail("type.size == size",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x32c,
                "VmValue *(anonymous namespace)::CreateConstruct(VmModule *, SynBase *, VmType, VmValue *, VmValue *, VmValue *, VmValue *)"
               );
}

Assistant:

VmValue* CreateConstruct(VmModule *module, SynBase *source, VmType type, VmValue *el0, VmValue *el1, VmValue *el2, VmValue *el3)
	{
		unsigned size = el0->type.size;

		if(el1)
			size += el1->type.size;

		if(el2)
			size += el2->type.size;

		if(el3)
			size += el3->type.size;

		assert(type.size == size);

		return CreateInstruction(module, source, type, VM_INST_CONSTRUCT, el0, el1, el2, el3);
	}